

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex
          (IntrinsicGeometryInterface *this)

{
  Edge e;
  Corner e_00;
  bool bVar1;
  runtime_error *this_00;
  double *pdVar2;
  Vector2 *pVVar3;
  ParentMeshT *in_RDI;
  Halfedge HVar4;
  Halfedge currHe;
  Halfedge firstHe;
  double coordSum;
  Vertex v;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  VertexSet *__range2;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *in_stack_fffffffffffffe78;
  SurfaceMesh *in_stack_fffffffffffffe80;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *in_stack_fffffffffffffe90;
  ParentMeshT *in_stack_fffffffffffffea0;
  ParentMeshT *local_140;
  size_t local_138;
  Vector2 local_100;
  Vector2 local_f0;
  ParentMeshT *local_e0;
  size_t local_d8;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_d0;
  double local_c0;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_b8;
  undefined1 local_78 [24];
  undefined1 *local_60;
  
  bVar1 = SurfaceMesh::usesImplicitTwin
                    ((SurfaceMesh *)
                     (in_RDI->vertexExpandCallbackList).
                     super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh"
              );
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe80);
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe80);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::MeshData
            ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *)
             in_stack_fffffffffffffea0,in_RDI);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator=
            ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *)
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::~MeshData
            ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *)
             in_stack_fffffffffffffe80);
  SurfaceMesh::vertices(in_stack_fffffffffffffe80);
  local_60 = local_78;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_fffffffffffffe80);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_fffffffffffffe80);
  do {
    bVar1 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_fffffffffffffe80,
                       (RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_fffffffffffffe78);
    if (!bVar1) {
      return;
    }
    local_b8 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)0x245be0);
    local_c0 = 0.0;
    local_d0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Vertex::halfedge((Vertex *)in_stack_fffffffffffffe80);
    local_e0 = local_d0.mesh;
    local_d8 = local_d0.ind;
    do {
      local_100 = Vector2::fromAngle(1.17731890878802e-317);
      in_stack_fffffffffffffe80 = (SurfaceMesh *)&in_RDI[1].vertexPermuteCallbackList;
      Halfedge::edge((Halfedge *)in_stack_fffffffffffffe80);
      e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)in_stack_fffffffffffffea0;
      e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           in_RDI;
      pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Edge,_double> *)
                          in_stack_fffffffffffffe90,e);
      local_f0 = Vector2::operator*(&local_100,*pdVar2);
      HVar4.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .ind = (size_t)in_stack_fffffffffffffea0;
      HVar4.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
      .mesh = in_RDI;
      pVVar3 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                         (in_stack_fffffffffffffe90,HVar4);
      pVVar3->x = local_f0.x;
      pVVar3->y = local_f0.y;
      Halfedge::corner((Halfedge *)0x245d2a);
      e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffea0;
      e_00.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_RDI;
      pdVar2 = MeshData<geometrycentral::surface::Corner,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Corner,_double> *)
                          in_stack_fffffffffffffe90,e_00);
      local_c0 = *pdVar2 + local_c0;
      bVar1 = Halfedge::isInterior((Halfedge *)0x245d6b);
      if (!bVar1) break;
      HVar4 = Halfedge::next((Halfedge *)in_stack_fffffffffffffe80);
      in_stack_fffffffffffffea0 =
           HVar4.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
      Halfedge::next((Halfedge *)in_stack_fffffffffffffe80);
      HVar4 = Halfedge::twin((Halfedge *)in_stack_fffffffffffffe80);
      local_140 = HVar4.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
      local_e0 = local_140;
      local_138 = HVar4.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind;
      local_d8 = local_138;
      bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
              operator!=((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          *)in_stack_fffffffffffffe80,
                         (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          *)in_stack_fffffffffffffe78);
    } while (bVar1);
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
               in_stack_fffffffffffffe80);
  } while( true );
}

Assistant:

void IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex() {

  if (!mesh.usesImplicitTwin()) {
    throw std::runtime_error("ERROR: Tangent spaces not implemented for general SurfaceMesh, use ManifoldSurfaceMesh");
  }

  edgeLengthsQ.ensureHave();
  cornerScaledAnglesQ.ensureHave();

  halfedgeVectorsInVertex = HalfedgeData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    double coordSum = 0.0;

    // Custom loop to orbit CCW
    Halfedge firstHe = v.halfedge();
    Halfedge currHe = firstHe;
    do {
      halfedgeVectorsInVertex[currHe] = Vector2::fromAngle(coordSum) * edgeLengths[currHe.edge()];
      coordSum += cornerScaledAngles[currHe.corner()];
      if (!currHe.isInterior()) break;
      currHe = currHe.next().next().twin();
    } while (currHe != firstHe);
  }
}